

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::If_AST_Node::eval_internal(If_AST_Node *this,Dispatch_State *t_ss)

{
  bool bVar1;
  Dispatch_Engine *pDVar2;
  Stack_Holder *pSVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Dispatch_State *t_e;
  long lVar5;
  ulong uVar6;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar7;
  Boxed_Value BVar8;
  
  AST_Node::eval((AST_Node *)&stack0xffffffffffffffc0,
                 (Dispatch_State *)
                 ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                 __align);
  bVar1 = AST_Node::get_bool_condition((Boxed_Value *)&stack0xffffffffffffffc0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  if (bVar1) {
    t_e = *(Dispatch_State **)
           ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex +
           0x10);
LAB_0019bc1c:
    BVar8 = AST_Node::eval(&this->super_AST_Node,t_e);
    _Var4._M_pi = BVar8.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    pDVar2 = t_ss[3].m_engine._M_data;
    pSVar3 = t_ss[3].m_stack_holder._M_data;
    if (0x20 < (ulong)((long)pSVar3 - (long)pDVar2)) {
      lVar5 = 0;
      for (uVar6 = 2; uVar6 < (ulong)((long)pSVar3 - (long)pDVar2 >> 4); uVar6 = uVar6 + 3) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*(long *)((long)&(pDVar2->m_mutex).super_mutex.super___mutex_base.
                                                   _M_mutex + lVar5 + 0x20) + 0x20),"else");
        pDVar2 = t_ss[3].m_engine._M_data;
        if (bVar1) {
          t_e = *(Dispatch_State **)
                 ((long)&(pDVar2->m_conversions).m_mutex.super_mutex.super___mutex_base._M_mutex +
                 lVar5 + 8);
          goto LAB_0019bc1c;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*(long *)((long)&(pDVar2->m_mutex).super_mutex.super___mutex_base.
                                                   _M_mutex + lVar5 + 0x20) + 0x20),"else if");
        if (bVar1) {
          AST_Node::eval((AST_Node *)&stack0xffffffffffffffc0,
                         *(Dispatch_State **)
                          ((long)&((t_ss[3].m_engine._M_data)->m_conversions).m_mutex.super_mutex.
                                  super___mutex_base._M_mutex + lVar5 + 8));
          bVar1 = AST_Node::get_bool_condition((Boxed_Value *)&stack0xffffffffffffffc0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
          if (bVar1) {
            t_e = *(Dispatch_State **)
                   ((long)&((t_ss[3].m_engine._M_data)->m_conversions).m_mutex.super_mutex.
                           super___mutex_base._M_mutex + lVar5 + 0x18);
            goto LAB_0019bc1c;
          }
        }
        pDVar2 = t_ss[3].m_engine._M_data;
        pSVar3 = t_ss[3].m_stack_holder._M_data;
        lVar5 = lVar5 + 0x30;
      }
    }
    sVar7 = Boxed_Value::Object_Data::get();
    _Var4 = sVar7.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{

          if (get_bool_condition(children[0]->eval(t_ss))) {
            return children[1]->eval(t_ss);
          } else {
            if (children.size() > 2) {
              size_t i = 2;
              while (i < children.size()) {
                if (children[i]->text == "else") {
                  return children[i+1]->eval(t_ss);
                }
                else if (children[i]->text == "else if") {
                  if (get_bool_condition(children[i+1]->eval(t_ss))) {
                    return children[i+2]->eval(t_ss);
                  }
                }
                i += 3;
              }
            }
          }

          return Boxed_Value();
        }